

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaDec.c
# Opt level: O2

int LzmaDec_DecodeReal2(CLzmaDec *p,SizeT limit,Byte *bufLimit)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  UInt16 *pUVar4;
  Byte *pBVar5;
  SizeT SVar6;
  short sVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  SizeT SVar13;
  uint uVar14;
  int iVar15;
  UInt16 *pUVar16;
  ulong uVar17;
  uint uVar18;
  long lVar19;
  Byte *pBVar20;
  uint uVar21;
  UInt32 UVar22;
  uint uVar23;
  ulong uVar24;
  byte bVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  ulong uVar30;
  ulong uVar31;
  byte *pbVar32;
  uint uVar33;
  UInt32 UVar34;
  ushort *puVar35;
  long lStack_f0;
  uint local_d4;
  UInt32 local_c8;
  UInt32 local_c4;
  UInt32 local_ac;
  ulong local_90;
  
  uVar24 = p->dicPos;
  do {
    UVar34 = p->processedPos;
    uVar11 = p->checkDicSize;
    local_90 = limit;
    if ((uVar11 == 0) &&
       (uVar31 = (ulong)((p->prop).dicSize - UVar34), local_90 = uVar24 + uVar31,
       limit - uVar24 <= uVar31)) {
      local_90 = limit;
    }
    pUVar4 = p->probs;
    uVar31 = (ulong)p->state;
    local_d4 = p->reps[0];
    local_c4 = p->reps[1];
    local_c8 = p->reps[2];
    uVar8 = (p->prop).pb;
    local_ac = p->reps[3];
    uVar9 = (p->prop).lp;
    pBVar5 = p->dic;
    SVar6 = p->dicBufSize;
    pbVar32 = p->buf;
    uVar21 = p->range;
    uVar10 = p->code;
    bVar2 = (byte)(p->prop).lc;
    uVar28 = 0;
LAB_00662b74:
    UVar22 = local_ac;
    uVar26 = local_d4;
    if (uVar21 < 0x1000000) {
      uVar21 = uVar21 << 8;
      bVar25 = *pbVar32;
      pbVar32 = pbVar32 + 1;
      uVar10 = (uint)bVar25 | uVar10 << 8;
    }
    uVar14 = UVar34 & ~(-1 << ((byte)uVar8 & 0x1f));
    uVar12 = (ulong)uVar14;
    uVar23 = (uint)uVar31;
    uVar30 = (ulong)(uVar23 << 4);
    uVar3 = pUVar4[uVar30 + uVar12];
    uVar33 = (uVar21 >> 0xb) * (uint)uVar3;
    uVar17 = (ulong)local_d4;
    uVar18 = uVar10 - uVar33;
    if (uVar10 < uVar33) {
      pUVar4[uVar30 + uVar12] = (short)(0x800 - uVar3 >> 5) + uVar3;
      pUVar16 = pUVar4 + 0x736;
      if (UVar34 != 0 || uVar11 != 0) {
        uVar31 = uVar24;
        if (uVar24 == 0) {
          uVar31 = SVar6;
        }
        pUVar16 = pUVar4 + 0x736 +
                  ((uint)(pBVar5[uVar31 - 1] >> (8 - bVar2 & 0x1f)) +
                  ((UVar34 & ~(-1 << ((byte)uVar9 & 0x1f))) << (bVar2 & 0x1f))) * 0x300;
      }
      if (uVar23 < 7) {
        uVar27 = uVar23 - 3;
        if (uVar23 < 3) {
          uVar27 = 0;
        }
        if (uVar33 < 0x1000000) {
          uVar33 = uVar33 * 0x100;
          bVar25 = *pbVar32;
          pbVar32 = pbVar32 + 1;
          uVar10 = (uint)bVar25 | uVar10 << 8;
        }
        uVar3 = pUVar16[1];
        uVar26 = (uVar33 >> 0xb) * (uint)uVar3;
        uVar21 = uVar10 - uVar26;
        if (uVar10 < uVar26) {
          sVar7 = (short)(0x800 - uVar3 >> 5);
          lStack_f0 = 2;
          uVar21 = uVar10;
        }
        else {
          uVar26 = uVar33 - uVar26;
          sVar7 = -(uVar3 >> 5);
          lStack_f0 = 3;
        }
        pUVar16[1] = sVar7 + uVar3;
        if (uVar26 < 0x1000000) {
          uVar26 = uVar26 << 8;
          bVar25 = *pbVar32;
          pbVar32 = pbVar32 + 1;
          uVar21 = (uint)bVar25 | uVar21 << 8;
        }
        uVar3 = pUVar16[lStack_f0];
        uVar18 = (uVar26 >> 0xb) * (uint)uVar3;
        uVar10 = (int)lStack_f0 * 2;
        uVar23 = uVar21 - uVar18;
        if (uVar21 < uVar18) {
          sVar7 = (short)(0x800 - uVar3 >> 5);
          uVar23 = uVar21;
        }
        else {
          uVar18 = uVar26 - uVar18;
          sVar7 = -(uVar3 >> 5);
          uVar10 = uVar10 | 1;
        }
        pUVar16[lStack_f0] = sVar7 + uVar3;
        uVar3 = pUVar16[uVar10];
        if (uVar18 < 0x1000000) {
          uVar18 = uVar18 << 8;
          bVar25 = *pbVar32;
          pbVar32 = pbVar32 + 1;
          uVar23 = (uint)bVar25 | uVar23 << 8;
        }
        uVar14 = (uVar18 >> 0xb) * (uint)uVar3;
        uVar21 = uVar10 * 2;
        uVar26 = uVar23 - uVar14;
        if (uVar23 < uVar14) {
          sVar7 = (short)(0x800 - uVar3 >> 5);
          uVar26 = uVar23;
        }
        else {
          uVar14 = uVar18 - uVar14;
          sVar7 = -(uVar3 >> 5);
          uVar21 = uVar21 | 1;
        }
        pUVar16[uVar10] = sVar7 + uVar3;
        uVar3 = pUVar16[uVar21];
        if (uVar14 < 0x1000000) {
          uVar14 = uVar14 << 8;
          bVar25 = *pbVar32;
          pbVar32 = pbVar32 + 1;
          uVar26 = (uint)bVar25 | uVar26 << 8;
        }
        uVar18 = (uVar14 >> 0xb) * (uint)uVar3;
        uVar10 = uVar21 * 2;
        uVar23 = uVar26 - uVar18;
        if (uVar26 < uVar18) {
          sVar7 = (short)(0x800 - uVar3 >> 5);
          uVar23 = uVar26;
        }
        else {
          uVar18 = uVar14 - uVar18;
          sVar7 = -(uVar3 >> 5);
          uVar10 = uVar10 | 1;
        }
        pUVar16[uVar21] = sVar7 + uVar3;
        uVar3 = pUVar16[uVar10];
        if (uVar18 < 0x1000000) {
          uVar18 = uVar18 << 8;
          bVar25 = *pbVar32;
          pbVar32 = pbVar32 + 1;
          uVar23 = (uint)bVar25 | uVar23 << 8;
        }
        uVar14 = (uVar18 >> 0xb) * (uint)uVar3;
        uVar21 = uVar10 * 2;
        uVar26 = uVar23 - uVar14;
        if (uVar23 < uVar14) {
          sVar7 = (short)(0x800 - uVar3 >> 5);
          uVar26 = uVar23;
        }
        else {
          uVar14 = uVar18 - uVar14;
          sVar7 = -(uVar3 >> 5);
          uVar21 = uVar21 | 1;
        }
        pUVar16[uVar10] = sVar7 + uVar3;
        uVar3 = pUVar16[uVar21];
        if (uVar14 < 0x1000000) {
          uVar14 = uVar14 << 8;
          bVar25 = *pbVar32;
          pbVar32 = pbVar32 + 1;
          uVar26 = (uint)bVar25 | uVar26 << 8;
        }
        uVar18 = (uVar14 >> 0xb) * (uint)uVar3;
        uVar10 = uVar21 * 2;
        uVar23 = uVar26 - uVar18;
        if (uVar26 < uVar18) {
          sVar7 = (short)(0x800 - uVar3 >> 5);
          uVar23 = uVar26;
        }
        else {
          uVar18 = uVar14 - uVar18;
          sVar7 = -(uVar3 >> 5);
          uVar10 = uVar10 | 1;
        }
        pUVar16[uVar21] = sVar7 + uVar3;
        uVar3 = pUVar16[uVar10];
        if (uVar18 < 0x1000000) {
          uVar18 = uVar18 << 8;
          bVar25 = *pbVar32;
          pbVar32 = pbVar32 + 1;
          uVar23 = (uint)bVar25 | uVar23 << 8;
        }
        uVar33 = (uVar18 >> 0xb) * (uint)uVar3;
        uVar26 = uVar10 * 2;
        uVar14 = uVar23 - uVar33;
        if (uVar23 < uVar33) {
          sVar7 = (short)(0x800 - uVar3 >> 5);
          uVar14 = uVar23;
        }
        else {
          uVar33 = uVar18 - uVar33;
          sVar7 = -(uVar3 >> 5);
          uVar26 = uVar26 | 1;
        }
        pUVar16[uVar10] = sVar7 + uVar3;
        uVar3 = pUVar16[uVar26];
        if (uVar33 < 0x1000000) {
          uVar33 = uVar33 << 8;
          bVar25 = *pbVar32;
          pbVar32 = pbVar32 + 1;
          uVar14 = (uint)bVar25 | uVar14 << 8;
        }
        uVar21 = (uVar33 >> 0xb) * (uint)uVar3;
        bVar25 = (char)uVar26 * '\x02';
        uVar10 = uVar14 - uVar21;
        if (uVar14 < uVar21) {
          pUVar16[uVar26] = (short)(0x800 - uVar3 >> 5) + uVar3;
          uVar10 = uVar14;
        }
        else {
          uVar21 = uVar33 - uVar21;
          pUVar16[uVar26] = uVar3 - (uVar3 >> 5);
          bVar25 = bVar25 | 1;
        }
      }
      else {
        SVar13 = 0;
        if (uVar24 < uVar17) {
          SVar13 = SVar6;
        }
        if (uVar33 < 0x1000000) {
          uVar33 = uVar33 * 0x100;
          bVar25 = *pbVar32;
          pbVar32 = pbVar32 + 1;
          uVar10 = (uint)bVar25 | uVar10 << 8;
        }
        bVar25 = pBVar5[SVar13 + (uVar24 - uVar17)];
        uVar26 = (uint)bVar25 + (uint)bVar25 & 0x100;
        uVar31 = (ulong)uVar26;
        uVar3 = pUVar16[uVar31 + 0x101];
        uVar18 = (uVar33 >> 0xb) * (uint)uVar3;
        uVar21 = uVar10 - uVar18;
        if (uVar10 < uVar18) {
          sVar7 = (short)(0x800 - uVar3 >> 5);
          uVar26 = uVar26 ^ 0x100;
          uVar14 = 2;
          uVar12 = (ulong)uVar26;
          uVar21 = uVar10;
        }
        else {
          uVar18 = uVar33 - uVar18;
          sVar7 = -(uVar3 >> 5);
          uVar14 = 3;
          uVar12 = uVar31;
        }
        pUVar16[uVar31 + 0x101] = sVar7 + uVar3;
        if (uVar18 < 0x1000000) {
          uVar18 = uVar18 << 8;
          bVar1 = *pbVar32;
          pbVar32 = pbVar32 + 1;
          uVar21 = (uint)bVar1 | uVar21 << 8;
        }
        uVar27 = (uint)bVar25 * 4 & uVar26;
        uVar31 = (ulong)uVar27;
        uVar3 = pUVar16[uVar12 + uVar31 + uVar14];
        uVar29 = (uVar18 >> 0xb) * (uint)uVar3;
        uVar33 = uVar14 * 2;
        uVar10 = uVar21 - uVar29;
        if (uVar21 < uVar29) {
          sVar7 = (short)(0x800 - uVar3 >> 5);
          uVar17 = (ulong)(uVar27 ^ uVar26);
          uVar10 = uVar21;
        }
        else {
          uVar29 = uVar18 - uVar29;
          sVar7 = -(uVar3 >> 5);
          uVar33 = uVar33 | 1;
          uVar17 = uVar31;
        }
        pUVar16[uVar12 + uVar31 + uVar14] = sVar7 + uVar3;
        uVar21 = (uint)bVar25 * 8 & (uint)uVar17;
        uVar31 = (ulong)uVar21;
        uVar3 = pUVar16[uVar17 + uVar31 + uVar33];
        if (uVar29 < 0x1000000) {
          uVar29 = uVar29 << 8;
          bVar1 = *pbVar32;
          pbVar32 = pbVar32 + 1;
          uVar10 = (uint)bVar1 | uVar10 << 8;
        }
        uVar14 = (uVar29 >> 0xb) * (uint)uVar3;
        uVar26 = uVar33 * 2;
        uVar18 = uVar10 - uVar14;
        if (uVar10 < uVar14) {
          sVar7 = (short)(0x800 - uVar3 >> 5);
          uVar12 = (ulong)(uVar21 ^ (uint)uVar17);
          uVar18 = uVar10;
        }
        else {
          uVar14 = uVar29 - uVar14;
          sVar7 = -(uVar3 >> 5);
          uVar26 = uVar26 | 1;
          uVar12 = uVar31;
        }
        pUVar16[uVar17 + uVar31 + uVar33] = sVar7 + uVar3;
        uVar21 = (uint)bVar25 << 4 & (uint)uVar12;
        uVar31 = (ulong)uVar21;
        uVar3 = pUVar16[uVar12 + uVar31 + uVar26];
        if (uVar14 < 0x1000000) {
          uVar14 = uVar14 << 8;
          bVar1 = *pbVar32;
          pbVar32 = pbVar32 + 1;
          uVar18 = (uint)bVar1 | uVar18 << 8;
        }
        uVar27 = (uVar14 >> 0xb) * (uint)uVar3;
        uVar10 = uVar26 * 2;
        uVar33 = uVar18 - uVar27;
        if (uVar18 < uVar27) {
          sVar7 = (short)(0x800 - uVar3 >> 5);
          uVar17 = (ulong)(uVar21 ^ (uint)uVar12);
          uVar33 = uVar18;
        }
        else {
          uVar27 = uVar14 - uVar27;
          sVar7 = -(uVar3 >> 5);
          uVar10 = uVar10 | 1;
          uVar17 = uVar31;
        }
        pUVar16[uVar12 + uVar31 + uVar26] = sVar7 + uVar3;
        uVar21 = (uint)bVar25 << 5 & (uint)uVar17;
        uVar31 = (ulong)uVar21;
        uVar3 = pUVar16[uVar17 + uVar31 + uVar10];
        if (uVar27 < 0x1000000) {
          uVar27 = uVar27 << 8;
          bVar1 = *pbVar32;
          pbVar32 = pbVar32 + 1;
          uVar33 = (uint)bVar1 | uVar33 << 8;
        }
        uVar14 = (uVar27 >> 0xb) * (uint)uVar3;
        uVar26 = uVar10 * 2;
        uVar18 = uVar33 - uVar14;
        if (uVar33 < uVar14) {
          sVar7 = (short)(0x800 - uVar3 >> 5);
          uVar12 = (ulong)(uVar21 ^ (uint)uVar17);
          uVar18 = uVar33;
        }
        else {
          uVar14 = uVar27 - uVar14;
          sVar7 = -(uVar3 >> 5);
          uVar26 = uVar26 | 1;
          uVar12 = uVar31;
        }
        pUVar16[uVar17 + uVar31 + uVar10] = sVar7 + uVar3;
        uVar21 = (uint)bVar25 << 6 & (uint)uVar12;
        uVar31 = (ulong)uVar21;
        uVar3 = pUVar16[uVar12 + uVar31 + uVar26];
        if (uVar14 < 0x1000000) {
          uVar14 = uVar14 << 8;
          bVar1 = *pbVar32;
          pbVar32 = pbVar32 + 1;
          uVar18 = (uint)bVar1 | uVar18 << 8;
        }
        uVar27 = (uVar14 >> 0xb) * (uint)uVar3;
        uVar10 = uVar26 * 2;
        uVar33 = uVar18 - uVar27;
        if (uVar18 < uVar27) {
          sVar7 = (short)(0x800 - uVar3 >> 5);
          uVar17 = (ulong)(uVar21 ^ (uint)uVar12);
          uVar33 = uVar18;
        }
        else {
          uVar27 = uVar14 - uVar27;
          sVar7 = -(uVar3 >> 5);
          uVar10 = uVar10 | 1;
          uVar17 = uVar31;
        }
        pUVar16[uVar12 + uVar31 + uVar26] = sVar7 + uVar3;
        uVar21 = (uint)bVar25 << 7 & (uint)uVar17;
        uVar31 = (ulong)uVar21;
        uVar3 = pUVar16[uVar17 + uVar31 + uVar10];
        if (uVar27 < 0x1000000) {
          uVar27 = uVar27 << 8;
          bVar1 = *pbVar32;
          pbVar32 = pbVar32 + 1;
          uVar33 = (uint)bVar1 | uVar33 << 8;
        }
        uVar14 = (uVar27 >> 0xb) * (uint)uVar3;
        uVar26 = uVar10 * 2;
        uVar18 = uVar33 - uVar14;
        if (uVar33 < uVar14) {
          sVar7 = (short)(0x800 - uVar3 >> 5);
          uVar12 = (ulong)(uVar21 ^ (uint)uVar17);
          uVar18 = uVar33;
        }
        else {
          uVar14 = uVar27 - uVar14;
          sVar7 = -(uVar3 >> 5);
          uVar26 = uVar26 | 1;
          uVar12 = uVar31;
        }
        pUVar16[uVar17 + uVar31 + uVar10] = sVar7 + uVar3;
        lVar19 = (ulong)((uint)bVar25 << 9 & (int)uVar12 * 2) + uVar12 * 2;
        uVar31 = (ulong)uVar26;
        uVar3 = *(ushort *)((long)pUVar16 + uVar31 * 2 + lVar19);
        if (uVar14 < 0x1000000) {
          uVar14 = uVar14 << 8;
          bVar25 = *pbVar32;
          pbVar32 = pbVar32 + 1;
          uVar18 = (uint)bVar25 | uVar18 << 8;
        }
        uVar27 = (uVar23 + (uint)(uVar23 < 10) * 3) - 6;
        uVar21 = (uVar14 >> 0xb) * (uint)uVar3;
        bVar25 = (char)uVar26 * '\x02';
        uVar10 = uVar18 - uVar21;
        if (uVar18 < uVar21) {
          *(ushort *)((long)pUVar16 + uVar31 * 2 + lVar19) = (short)(0x800 - uVar3 >> 5) + uVar3;
          uVar10 = uVar18;
        }
        else {
          uVar21 = uVar14 - uVar21;
          *(ushort *)((long)pUVar16 + uVar31 * 2 + lVar19) = uVar3 - (uVar3 >> 5);
          bVar25 = bVar25 | 1;
        }
      }
      pBVar5[uVar24] = bVar25;
LAB_006635a7:
      uVar31 = (ulong)uVar27;
      uVar24 = uVar24 + 1;
      uVar12 = 1;
      goto LAB_00664116;
    }
    uVar21 = uVar21 - uVar33;
    pUVar4[uVar30 + uVar12] = uVar3 - (uVar3 >> 5);
    if (uVar21 < 0x1000000) {
      uVar21 = uVar21 * 0x100;
      bVar25 = *pbVar32;
      pbVar32 = pbVar32 + 1;
      uVar18 = uVar18 * 0x100 | (uint)bVar25;
    }
    uVar3 = pUVar4[uVar31 + 0xc0];
    uVar33 = (uVar21 >> 0xb) * (uint)uVar3;
    uVar10 = uVar18 - uVar33;
    if (uVar18 < uVar33) {
      pUVar4[uVar31 + 0xc0] = (short)(0x800 - uVar3 >> 5) + uVar3;
      uVar23 = uVar23 + 0xc;
      puVar35 = pUVar4 + 0x332;
    }
    else {
      pUVar4[uVar31 + 0xc0] = uVar3 - (uVar3 >> 5);
      if (UVar34 == 0 && uVar11 == 0) {
        return 1;
      }
      uVar21 = uVar21 - uVar33;
      if (uVar21 < 0x1000000) {
        uVar21 = uVar21 * 0x100;
        bVar25 = *pbVar32;
        pbVar32 = pbVar32 + 1;
        uVar10 = (uint)bVar25 | uVar10 * 0x100;
      }
      uVar3 = pUVar4[uVar31 + 0xcc];
      uVar33 = (uVar21 >> 0xb) * (uint)uVar3;
      uVar18 = uVar10 - uVar33;
      if (uVar10 < uVar33) {
        pUVar4[uVar31 + 0xcc] = (short)(0x800 - uVar3 >> 5) + uVar3;
        if (uVar33 < 0x1000000) {
          uVar33 = uVar33 * 0x100;
          bVar25 = *pbVar32;
          pbVar32 = pbVar32 + 1;
          uVar10 = (uint)bVar25 | uVar10 << 8;
        }
        uVar3 = pUVar4[uVar30 + uVar12 + 0xf0];
        uVar21 = (uVar33 >> 0xb) * (uint)uVar3;
        uVar18 = uVar10 - uVar21;
        if (uVar10 < uVar21) {
          pUVar4[uVar30 + uVar12 + 0xf0] = (short)(0x800 - uVar3 >> 5) + uVar3;
          SVar13 = 0;
          if (uVar24 < uVar17) {
            SVar13 = SVar6;
          }
          pBVar5[uVar24] = pBVar5[SVar13 + (uVar24 - uVar17)];
          uVar27 = (uint)(6 < uVar23) * 2 + 9;
          goto LAB_006635a7;
        }
        uVar33 = uVar33 - uVar21;
        pUVar4[uVar30 + uVar12 + 0xf0] = uVar3 - (uVar3 >> 5);
        uVar26 = local_c4;
      }
      else {
        uVar21 = uVar21 - uVar33;
        pUVar4[uVar31 + 0xcc] = uVar3 - (uVar3 >> 5);
        if (uVar21 < 0x1000000) {
          uVar21 = uVar21 * 0x100;
          bVar25 = *pbVar32;
          pbVar32 = pbVar32 + 1;
          uVar18 = uVar18 * 0x100 | (uint)bVar25;
        }
        uVar3 = pUVar4[uVar31 + 0xd8];
        uVar33 = (uVar21 >> 0xb) * (uint)uVar3;
        uVar10 = uVar18 - uVar33;
        if (uVar18 < uVar33) {
          pUVar4[uVar31 + 0xd8] = (short)(0x800 - uVar3 >> 5) + uVar3;
          local_d4 = local_c4;
        }
        else {
          uVar21 = uVar21 - uVar33;
          pUVar4[uVar31 + 0xd8] = uVar3 - (uVar3 >> 5);
          if (uVar21 < 0x1000000) {
            uVar21 = uVar21 * 0x100;
            bVar25 = *pbVar32;
            pbVar32 = pbVar32 + 1;
            uVar10 = uVar10 * 0x100 | (uint)bVar25;
          }
          uVar3 = pUVar4[uVar31 + 0xe4];
          uVar33 = (uVar21 >> 0xb) * (uint)uVar3;
          uVar18 = uVar10 - uVar33;
          if (uVar10 < uVar33) {
            sVar7 = (short)(0x800 - uVar3 >> 5);
            uVar18 = uVar10;
            UVar22 = local_c8;
          }
          else {
            uVar33 = uVar21 - uVar33;
            sVar7 = -(uVar3 >> 5);
            local_ac = local_c8;
          }
          pUVar4[uVar31 + 0xe4] = sVar7 + uVar3;
          local_c8 = local_c4;
          local_d4 = UVar22;
        }
      }
      uVar23 = (uint)(6 < uVar23) * 3 + 8;
      puVar35 = pUVar4 + 0x534;
      local_c4 = uVar26;
    }
    uVar31 = (ulong)uVar23;
    uVar3 = *puVar35;
    if (uVar33 < 0x1000000) {
      uVar33 = uVar33 << 8;
      bVar25 = *pbVar32;
      pbVar32 = pbVar32 + 1;
      uVar18 = uVar18 << 8 | (uint)bVar25;
    }
    uVar21 = (uVar33 >> 0xb) * (uint)uVar3;
    uVar28 = uVar18 - uVar21;
    if (uVar18 < uVar21) {
      *puVar35 = (short)(0x800 - uVar3 >> 5) + uVar3;
      if (uVar21 < 0x1000000) {
        uVar21 = uVar21 * 0x100;
        bVar25 = *pbVar32;
        pbVar32 = pbVar32 + 1;
        uVar18 = uVar18 << 8 | (uint)bVar25;
      }
      uVar12 = (ulong)(uVar14 << 3);
      uVar3 = puVar35[uVar12 + 3];
      uVar28 = (uVar21 >> 0xb) * (uint)uVar3;
      uVar10 = uVar18 - uVar28;
      if (uVar18 < uVar28) {
        sVar7 = (short)(0x800 - uVar3 >> 5);
        lVar19 = 2;
        uVar10 = uVar18;
      }
      else {
        uVar28 = uVar21 - uVar28;
        sVar7 = -(uVar3 >> 5);
        lVar19 = 3;
      }
      puVar35[uVar12 + 3] = sVar7 + uVar3;
      if (uVar28 < 0x1000000) {
        uVar28 = uVar28 << 8;
        bVar25 = *pbVar32;
        pbVar32 = pbVar32 + 1;
        uVar10 = uVar10 << 8 | (uint)bVar25;
      }
      uVar3 = puVar35[uVar12 + lVar19 + 2];
      uVar14 = (uVar28 >> 0xb) * (uint)uVar3;
      uVar26 = (int)lVar19 * 2;
      uVar18 = uVar10 - uVar14;
      if (uVar10 < uVar14) {
        sVar7 = (short)(0x800 - uVar3 >> 5);
        uVar18 = uVar10;
      }
      else {
        uVar14 = uVar28 - uVar14;
        sVar7 = -(uVar3 >> 5);
        uVar26 = uVar26 | 1;
      }
      puVar35[uVar12 + lVar19 + 2] = sVar7 + uVar3;
      uVar3 = puVar35[uVar12 + (ulong)uVar26 + 2];
      if (uVar14 < 0x1000000) {
        uVar14 = uVar14 << 8;
        bVar25 = *pbVar32;
        pbVar32 = pbVar32 + 1;
        uVar18 = uVar18 << 8 | (uint)bVar25;
      }
      uVar21 = (uVar14 >> 0xb) * (uint)uVar3;
      uVar28 = uVar26 * 2;
      uVar10 = uVar18 - uVar21;
      if (uVar18 < uVar21) {
        sVar7 = (short)(0x800 - uVar3 >> 5);
        uVar10 = uVar18;
      }
      else {
        uVar21 = uVar14 - uVar21;
        sVar7 = -(uVar3 >> 5);
        uVar28 = uVar28 | 1;
      }
      puVar35[uVar12 + (ulong)uVar26 + 2] = sVar7 + uVar3;
      uVar28 = uVar28 - 8;
    }
    else {
      uVar33 = uVar33 - uVar21;
      *puVar35 = uVar3 - (uVar3 >> 5);
      if (uVar33 < 0x1000000) {
        uVar33 = uVar33 * 0x100;
        bVar25 = *pbVar32;
        pbVar32 = pbVar32 + 1;
        uVar28 = uVar28 * 0x100 | (uint)bVar25;
      }
      uVar3 = puVar35[1];
      uVar21 = (uVar33 >> 0xb) * (uint)uVar3;
      uVar10 = uVar28 - uVar21;
      if (uVar28 < uVar21) {
        puVar35[1] = (short)(0x800 - uVar3 >> 5) + uVar3;
        if (uVar21 < 0x1000000) {
          uVar21 = uVar21 * 0x100;
          bVar25 = *pbVar32;
          pbVar32 = pbVar32 + 1;
          uVar28 = uVar28 << 8 | (uint)bVar25;
        }
        uVar12 = (ulong)(uVar14 << 3);
        uVar3 = puVar35[uVar12 + 0x83];
        uVar26 = (uVar21 >> 0xb) * (uint)uVar3;
        uVar10 = uVar28 - uVar26;
        if (uVar28 < uVar26) {
          sVar7 = (short)(0x800 - uVar3 >> 5);
          lVar19 = 2;
          uVar10 = uVar28;
        }
        else {
          uVar26 = uVar21 - uVar26;
          sVar7 = -(uVar3 >> 5);
          lVar19 = 3;
        }
        puVar35[uVar12 + 0x83] = sVar7 + uVar3;
        if (uVar26 < 0x1000000) {
          uVar26 = uVar26 << 8;
          bVar25 = *pbVar32;
          pbVar32 = pbVar32 + 1;
          uVar10 = uVar10 << 8 | (uint)bVar25;
        }
        uVar3 = puVar35[uVar12 + lVar19 + 0x82];
        uVar14 = (uVar26 >> 0xb) * (uint)uVar3;
        uVar28 = (int)lVar19 * 2;
        uVar18 = uVar10 - uVar14;
        if (uVar10 < uVar14) {
          sVar7 = (short)(0x800 - uVar3 >> 5);
          uVar18 = uVar10;
        }
        else {
          uVar14 = uVar26 - uVar14;
          sVar7 = -(uVar3 >> 5);
          uVar28 = uVar28 | 1;
        }
        puVar35[uVar12 + lVar19 + 0x82] = sVar7 + uVar3;
        uVar17 = (ulong)uVar28;
        uVar3 = puVar35[uVar12 + uVar17 + 0x82];
        if (uVar14 < 0x1000000) {
          uVar14 = uVar14 << 8;
          bVar25 = *pbVar32;
          pbVar32 = pbVar32 + 1;
          uVar18 = (uint)bVar25 | uVar18 << 8;
        }
        uVar21 = (uVar14 >> 0xb) * (uint)uVar3;
        uVar28 = uVar28 * 2;
        uVar10 = uVar18 - uVar21;
        if (uVar18 < uVar21) {
          puVar35[uVar12 + uVar17 + 0x82] = (short)(0x800 - uVar3 >> 5) + uVar3;
          uVar10 = uVar18;
        }
        else {
          uVar21 = uVar14 - uVar21;
          puVar35[uVar12 + uVar17 + 0x82] = uVar3 - (uVar3 >> 5);
          uVar28 = uVar28 | 1;
        }
      }
      else {
        uVar21 = uVar33 - uVar21;
        puVar35[1] = uVar3 - (uVar3 >> 5);
        uVar12 = 1;
        do {
          uVar26 = uVar21;
          uVar18 = uVar10;
          if (uVar21 < 0x1000000) {
            uVar26 = uVar21 << 8;
            bVar25 = *pbVar32;
            pbVar32 = pbVar32 + 1;
            uVar18 = uVar10 << 8 | (uint)bVar25;
          }
          uVar3 = puVar35[uVar12 + 0x102];
          uVar21 = (uVar26 >> 0xb) * (uint)uVar3;
          uVar28 = (int)uVar12 * 2;
          uVar10 = uVar18 - uVar21;
          if (uVar18 < uVar21) {
            sVar7 = (short)(0x800 - uVar3 >> 5);
            uVar10 = uVar18;
          }
          else {
            uVar21 = uVar26 - uVar21;
            sVar7 = -(uVar3 >> 5);
            uVar28 = uVar28 | 1;
          }
          puVar35[uVar12 + 0x102] = sVar7 + uVar3;
          uVar12 = (ulong)uVar28;
        } while (uVar28 < 0x100);
        uVar28 = uVar28 - 0xf0;
      }
    }
    if (uVar23 < 0xc) {
LAB_00664094:
      uVar17 = local_90 - uVar24;
      if (uVar17 == 0) {
        p->dicPos = local_90;
        return 1;
      }
      uVar28 = uVar28 + 2;
      uVar12 = uVar17 & 0xffffffff;
      if (uVar28 <= uVar17) {
        uVar12 = (ulong)uVar28;
      }
      SVar13 = 0;
      if (uVar24 < local_d4) {
        SVar13 = SVar6;
      }
      SVar13 = SVar13 + (uVar24 - local_d4);
      uVar28 = uVar28 - (int)uVar12;
      if (SVar6 - SVar13 < uVar12) {
        lVar19 = 0;
        do {
          pBVar5[lVar19 + uVar24] = pBVar5[SVar13];
          SVar13 = SVar13 + 1;
          if (SVar13 == SVar6) {
            SVar13 = 0;
          }
          lVar19 = lVar19 + 1;
        } while ((int)uVar12 != (int)lVar19);
        uVar24 = uVar24 + lVar19;
      }
      else {
        pBVar20 = pBVar5 + uVar24;
        uVar17 = uVar12;
        do {
          *pBVar20 = pBVar20[SVar13 - uVar24];
          pBVar20 = pBVar20 + 1;
          uVar17 = uVar17 - 1;
        } while (uVar17 != 0);
        uVar24 = uVar24 + uVar12;
      }
LAB_00664116:
      UVar34 = UVar34 + (int)uVar12;
      if ((local_90 <= uVar24) || (bufLimit <= pbVar32)) goto LAB_0066412e;
      goto LAB_00662b74;
    }
    uVar26 = 3;
    if (uVar28 < 3) {
      uVar26 = uVar28;
    }
    if (uVar21 < 0x1000000) {
      uVar21 = uVar21 << 8;
      bVar25 = *pbVar32;
      pbVar32 = pbVar32 + 1;
      uVar10 = (uint)bVar25 | uVar10 << 8;
    }
    uVar31 = (ulong)(uVar26 << 7);
    uVar3 = *(ushort *)((long)pUVar4 + uVar31 + 0x362);
    uVar18 = (uVar21 >> 0xb) * (uint)uVar3;
    uVar26 = uVar10 - uVar18;
    if (uVar10 < uVar18) {
      sVar7 = (short)(0x800 - uVar3 >> 5);
      lStack_f0 = 2;
      uVar26 = uVar10;
    }
    else {
      uVar18 = uVar21 - uVar18;
      sVar7 = -(uVar3 >> 5);
      lStack_f0 = 3;
    }
    lVar19 = uVar31 + 0x360;
    *(ushort *)((long)pUVar4 + uVar31 + 0x362) = sVar7 + uVar3;
    if (uVar18 < 0x1000000) {
      uVar18 = uVar18 << 8;
      bVar25 = *pbVar32;
      pbVar32 = pbVar32 + 1;
      uVar26 = (uint)bVar25 | uVar26 << 8;
    }
    uVar3 = *(ushort *)((long)pUVar4 + lStack_f0 * 2 + lVar19);
    uVar14 = (uVar18 >> 0xb) * (uint)uVar3;
    uVar21 = (int)lStack_f0 * 2;
    uVar10 = uVar26 - uVar14;
    if (uVar26 < uVar14) {
      sVar7 = (short)(0x800 - uVar3 >> 5);
      uVar10 = uVar26;
    }
    else {
      uVar14 = uVar18 - uVar14;
      sVar7 = -(uVar3 >> 5);
      uVar21 = uVar21 | 1;
    }
    *(ushort *)((long)pUVar4 + lStack_f0 * 2 + lVar19) = sVar7 + uVar3;
    uVar3 = *(ushort *)((long)pUVar4 + (ulong)uVar21 * 2 + lVar19);
    if (uVar14 < 0x1000000) {
      uVar14 = uVar14 << 8;
      bVar25 = *pbVar32;
      pbVar32 = pbVar32 + 1;
      uVar10 = (uint)bVar25 | uVar10 << 8;
    }
    uVar33 = (uVar14 >> 0xb) * (uint)uVar3;
    uVar26 = uVar21 * 2;
    uVar18 = uVar10 - uVar33;
    if (uVar10 < uVar33) {
      sVar7 = (short)(0x800 - uVar3 >> 5);
      uVar18 = uVar10;
    }
    else {
      uVar33 = uVar14 - uVar33;
      sVar7 = -(uVar3 >> 5);
      uVar26 = uVar26 | 1;
    }
    *(ushort *)((long)pUVar4 + (ulong)uVar21 * 2 + lVar19) = sVar7 + uVar3;
    uVar3 = *(ushort *)((long)pUVar4 + (ulong)uVar26 * 2 + lVar19);
    if (uVar33 < 0x1000000) {
      uVar33 = uVar33 << 8;
      bVar25 = *pbVar32;
      pbVar32 = pbVar32 + 1;
      uVar18 = (uint)bVar25 | uVar18 << 8;
    }
    uVar14 = (uVar33 >> 0xb) * (uint)uVar3;
    uVar21 = uVar26 * 2;
    uVar10 = uVar18 - uVar14;
    if (uVar18 < uVar14) {
      sVar7 = (short)(0x800 - uVar3 >> 5);
      uVar10 = uVar18;
    }
    else {
      uVar14 = uVar33 - uVar14;
      sVar7 = -(uVar3 >> 5);
      uVar21 = uVar21 | 1;
    }
    *(ushort *)((long)pUVar4 + (ulong)uVar26 * 2 + lVar19) = sVar7 + uVar3;
    uVar3 = *(ushort *)((long)pUVar4 + (ulong)uVar21 * 2 + lVar19);
    if (uVar14 < 0x1000000) {
      uVar14 = uVar14 << 8;
      bVar25 = *pbVar32;
      pbVar32 = pbVar32 + 1;
      uVar10 = (uint)bVar25 | uVar10 << 8;
    }
    uVar33 = (uVar14 >> 0xb) * (uint)uVar3;
    uVar26 = uVar21 * 2;
    uVar18 = uVar10 - uVar33;
    if (uVar10 < uVar33) {
      sVar7 = (short)(0x800 - uVar3 >> 5);
      uVar18 = uVar10;
    }
    else {
      uVar33 = uVar14 - uVar33;
      sVar7 = -(uVar3 >> 5);
      uVar26 = uVar26 | 1;
    }
    *(ushort *)((long)pUVar4 + (ulong)uVar21 * 2 + lVar19) = sVar7 + uVar3;
    uVar3 = *(ushort *)((long)pUVar4 + (ulong)uVar26 * 2 + lVar19);
    if (uVar33 < 0x1000000) {
      uVar33 = uVar33 << 8;
      bVar25 = *pbVar32;
      pbVar32 = pbVar32 + 1;
      uVar18 = (uint)bVar25 | uVar18 << 8;
    }
    uVar21 = (uVar33 >> 0xb) * (uint)uVar3;
    uVar14 = uVar26 * 2;
    uVar10 = uVar18 - uVar21;
    if (uVar18 < uVar21) {
      sVar7 = (short)(0x800 - uVar3 >> 5);
      uVar10 = uVar18;
    }
    else {
      uVar21 = uVar33 - uVar21;
      sVar7 = -(uVar3 >> 5);
      uVar14 = uVar14 | 1;
    }
    *(ushort *)((long)pUVar4 + (ulong)uVar26 * 2 + lVar19) = sVar7 + uVar3;
    uVar26 = uVar14 - 0x40;
    if (uVar26 < 4) {
LAB_00664038:
      uVar18 = UVar34;
      if (uVar11 != 0) {
        uVar18 = uVar11;
      }
      if (uVar18 <= uVar26) {
        p->dicPos = uVar24;
        return 1;
      }
      uVar31 = (ulong)(0x12 < uVar23) * 3 + 7;
      local_ac = local_c8;
      local_c8 = local_c4;
      local_c4 = local_d4;
      local_d4 = uVar26 + 1;
      goto LAB_00664094;
    }
    uVar18 = uVar14 & 1 | 2;
    if (uVar26 < 0xe) {
      iVar15 = (uVar26 >> 1) - 1;
      uVar18 = uVar18 << ((byte)iVar15 & 0x1f);
      uVar12 = (ulong)uVar26;
      uVar14 = 1;
      uVar31 = 1;
      uVar26 = uVar18;
      do {
        uVar33 = uVar21;
        if (uVar21 < 0x1000000) {
          uVar33 = uVar21 << 8;
          bVar25 = *pbVar32;
          pbVar32 = pbVar32 + 1;
          uVar10 = uVar10 << 8 | (uint)bVar25;
        }
        uVar3 = pUVar4[(ulong)uVar18 + ((uVar31 + 0x2af) - uVar12)];
        uVar21 = (uVar33 >> 0xb) * (uint)uVar3;
        uVar27 = (int)uVar31 * 2;
        uVar29 = uVar10 - uVar21;
        if (uVar10 < uVar21) {
          sVar7 = (short)(0x800 - uVar3 >> 5);
        }
        else {
          uVar21 = uVar33 - uVar21;
          sVar7 = -(uVar3 >> 5);
          uVar27 = uVar27 | 1;
          uVar26 = uVar26 | uVar14;
          uVar10 = uVar29;
        }
        pUVar4[(ulong)uVar18 + ((uVar31 + 0x2af) - uVar12)] = sVar7 + uVar3;
        uVar14 = uVar14 * 2;
        iVar15 = iVar15 + -1;
        uVar31 = (ulong)uVar27;
      } while (iVar15 != 0);
      goto LAB_00664038;
    }
    iVar15 = (uVar26 >> 1) - 5;
    do {
      uVar26 = uVar21;
      if (uVar21 < 0x1000000) {
        bVar25 = *pbVar32;
        pbVar32 = pbVar32 + 1;
        uVar10 = (uint)bVar25 | uVar10 << 8;
        uVar26 = uVar21 << 8;
      }
      uVar21 = uVar26 >> 1;
      uVar14 = (int)(uVar10 - uVar21) >> 0x1f;
      uVar18 = uVar14 + uVar18 * 2 + 1;
      uVar10 = (uVar14 & uVar21) + (uVar10 - uVar21);
      iVar15 = iVar15 + -1;
    } while (iVar15 != 0);
    if (uVar26 < 0x2000000) {
      uVar21 = uVar21 << 8;
      bVar25 = *pbVar32;
      pbVar32 = pbVar32 + 1;
      uVar10 = (uint)bVar25 | uVar10 * 0x100;
    }
    uVar26 = uVar18 * 0x10;
    uVar3 = pUVar4[0x323];
    uVar14 = (uVar21 >> 0xb) * (uint)uVar3;
    uVar18 = uVar10 - uVar14;
    if (uVar10 < uVar14) {
      sVar7 = (short)(0x800 - uVar3 >> 5);
      lStack_f0 = 2;
      uVar18 = uVar10;
    }
    else {
      uVar14 = uVar21 - uVar14;
      sVar7 = -(uVar3 >> 5);
      uVar26 = uVar26 | 1;
      lStack_f0 = 3;
    }
    pUVar4[0x323] = sVar7 + uVar3;
    if (uVar14 < 0x1000000) {
      uVar14 = uVar14 << 8;
      bVar25 = *pbVar32;
      pbVar32 = pbVar32 + 1;
      uVar18 = (uint)bVar25 | uVar18 << 8;
    }
    uVar3 = pUVar4[lStack_f0 + 0x322];
    uVar33 = (uVar14 >> 0xb) * (uint)uVar3;
    uVar21 = (int)lStack_f0 * 2;
    uVar10 = uVar18 - uVar33;
    if (uVar18 < uVar33) {
      sVar7 = (short)(0x800 - uVar3 >> 5);
      uVar10 = uVar18;
    }
    else {
      uVar33 = uVar14 - uVar33;
      sVar7 = -(uVar3 >> 5);
      uVar21 = uVar21 | 1;
      uVar26 = uVar26 | 2;
    }
    pUVar4[lStack_f0 + 0x322] = sVar7 + uVar3;
    uVar3 = pUVar4[(ulong)uVar21 + 0x322];
    if (uVar33 < 0x1000000) {
      uVar33 = uVar33 << 8;
      bVar25 = *pbVar32;
      pbVar32 = pbVar32 + 1;
      uVar10 = (uint)bVar25 | uVar10 << 8;
    }
    uVar27 = (uVar33 >> 0xb) * (uint)uVar3;
    uVar18 = uVar21 * 2;
    uVar14 = uVar10 - uVar27;
    if (uVar10 < uVar27) {
      sVar7 = (short)(0x800 - uVar3 >> 5);
      uVar14 = uVar10;
    }
    else {
      uVar27 = uVar33 - uVar27;
      sVar7 = -(uVar3 >> 5);
      uVar18 = uVar18 | 1;
      uVar26 = uVar26 | 4;
    }
    pUVar4[(ulong)uVar21 + 0x322] = sVar7 + uVar3;
    uVar3 = pUVar4[(ulong)uVar18 + 0x322];
    if (uVar27 < 0x1000000) {
      uVar27 = uVar27 << 8;
      bVar25 = *pbVar32;
      pbVar32 = pbVar32 + 1;
      uVar14 = (uint)bVar25 | uVar14 << 8;
    }
    uVar21 = (uVar27 >> 0xb) * (uint)uVar3;
    uVar10 = uVar14 - uVar21;
    if (uVar14 < uVar21) {
      sVar7 = (short)(0x800 - uVar3 >> 5);
      uVar10 = uVar14;
    }
    else {
      uVar21 = uVar27 - uVar21;
      sVar7 = -(uVar3 >> 5);
      uVar26 = uVar26 | 8;
    }
    pUVar4[(ulong)uVar18 + 0x322] = sVar7 + uVar3;
    if (uVar26 != 0xffffffff) goto LAB_00664038;
    uVar28 = uVar28 + 0x112;
    uVar31 = (ulong)(uVar23 - 0xc);
LAB_0066412e:
    if (uVar21 < 0x1000000) {
      uVar21 = uVar21 << 8;
      bVar2 = *pbVar32;
      pbVar32 = pbVar32 + 1;
      uVar10 = (uint)bVar2 | uVar10 << 8;
    }
    p->buf = pbVar32;
    p->range = uVar21;
    p->code = uVar10;
    p->remainLen = uVar28;
    p->dicPos = uVar24;
    p->processedPos = UVar34;
    p->reps[0] = local_d4;
    p->reps[1] = local_c4;
    p->reps[2] = local_c8;
    p->reps[3] = local_ac;
    p->state = (uint)uVar31;
    if ((p->checkDicSize == 0) && (uVar11 = (p->prop).dicSize, uVar11 <= UVar34)) {
      p->checkDicSize = uVar11;
    }
    LzmaDec_WriteRem(p,limit);
    uVar24 = p->dicPos;
    if (limit <= uVar24) {
      uVar11 = p->remainLen;
LAB_00664219:
      if (0x112 < uVar11) {
        p->remainLen = 0x112;
      }
      return 0;
    }
    uVar11 = p->remainLen;
    if ((bufLimit <= p->buf) || (0x111 < uVar11)) goto LAB_00664219;
  } while( true );
}

Assistant:

static int MY_FAST_CALL LzmaDec_DecodeReal2(CLzmaDec *p, SizeT limit, const Byte *bufLimit)
{
  do
  {
    SizeT limit2 = limit;
    if (p->checkDicSize == 0)
    {
      UInt32 rem = p->prop.dicSize - p->processedPos;
      if (limit - p->dicPos > rem)
        limit2 = p->dicPos + rem;
    }
    
    RINOK(LzmaDec_DecodeReal(p, limit2, bufLimit));
    
    if (p->checkDicSize == 0 && p->processedPos >= p->prop.dicSize)
      p->checkDicSize = p->prop.dicSize;
    
    LzmaDec_WriteRem(p, limit);
  }
  while (p->dicPos < limit && p->buf < bufLimit && p->remainLen < kMatchSpecLenStart);

  if (p->remainLen > kMatchSpecLenStart)
    p->remainLen = kMatchSpecLenStart;

  return 0;
}